

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::isScalar(QPDFObjectHandle *this)

{
  bool bVar1;
  undefined1 local_11;
  QPDFObjectHandle *this_local;
  
  bVar1 = isBool(this);
  local_11 = true;
  if (!bVar1) {
    bVar1 = isInteger(this);
    local_11 = true;
    if (!bVar1) {
      bVar1 = isName(this);
      local_11 = true;
      if (!bVar1) {
        bVar1 = isNull(this);
        local_11 = true;
        if (!bVar1) {
          bVar1 = isReal(this);
          local_11 = true;
          if (!bVar1) {
            local_11 = isString(this);
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool
QPDFObjectHandle::isScalar() const
{
    return isBool() || isInteger() || isName() || isNull() || isReal() || isString();
}